

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_shift_left_uint64_256(mzd_local_t *res,mzd_local_t *val,uint count)

{
  byte bVar1;
  
  bVar1 = (byte)count;
  res->w64[3] = val->w64[3] << (bVar1 & 0x3f) | val->w64[2] >> 0x40 - (bVar1 & 0x3f);
  res->w64[2] = val->w64[2] << (bVar1 & 0x3f) | val->w64[1] >> 0x40 - (bVar1 & 0x3f);
  res->w64[1] = val->w64[1] << (bVar1 & 0x3f) | val->w64[0] >> 0x40 - (bVar1 & 0x3f);
  res->w64[0] = val->w64[0] << ((ulong)count & 0x3f);
  return;
}

Assistant:

void mzd_shift_left_uint64_256(mzd_local_t* res, const mzd_local_t* val, unsigned int count) {
  const unsigned int right_count = 8 * sizeof(word) - count;
  const block_t* block           = CONST_BLOCK(val, 0);
  block_t* rblock                = BLOCK(res, 0);

  rblock->w64[3] = (block->w64[3] << count) | (block->w64[2] >> right_count);
  rblock->w64[2] = (block->w64[2] << count) | (block->w64[1] >> right_count);
  rblock->w64[1] = (block->w64[1] << count) | (block->w64[0] >> right_count);
  rblock->w64[0] = block->w64[0] << count;
}